

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O2

void tcg_gen_xori_i64_mips(TCGContext_conflict3 *tcg_ctx,TCGv_i64 ret,TCGv_i64 arg1,int64_t arg2)

{
  TCGOp *pTVar1;
  TCGv_i64 arg2_00;
  uintptr_t o_1;
  uintptr_t o;
  
  if (arg2 == -1) {
    pTVar1 = tcg_emit_op_mips(tcg_ctx,INDEX_op_not_i64);
    pTVar1->args[0] = (TCGArg)(ret + (long)tcg_ctx);
    pTVar1->args[1] = (TCGArg)(arg1 + (long)tcg_ctx);
    return;
  }
  if (arg2 == 0) {
    tcg_gen_mov_i64_mips(tcg_ctx,ret,arg1);
    return;
  }
  arg2_00 = tcg_const_i64_mips(tcg_ctx,arg2);
  tcg_gen_xor_i64_mips(tcg_ctx,ret,arg1,arg2_00);
  tcg_temp_free_internal_mips(tcg_ctx,(TCGTemp *)(arg2_00 + (long)tcg_ctx));
  return;
}

Assistant:

void tcg_gen_xori_i64(TCGContext *tcg_ctx, TCGv_i64 ret, TCGv_i64 arg1, int64_t arg2)
{
#if TCG_TARGET_REG_BITS == 32
        tcg_gen_xori_i32(tcg_ctx, TCGV_LOW(tcg_ctx, ret), TCGV_LOW(tcg_ctx, arg1), arg2);
        tcg_gen_xori_i32(tcg_ctx, TCGV_HIGH(tcg_ctx, ret), TCGV_HIGH(tcg_ctx, arg1), arg2 >> 32);
        return;
#else
    /* Some cases can be optimized here.  */
    if (arg2 == 0) {
        tcg_gen_mov_i64(tcg_ctx, ret, arg1);
    } else if (arg2 == -1 && TCG_TARGET_HAS_not_i64) {
        /* Don't recurse with tcg_gen_not_i64.  */
        tcg_gen_op2_i64(tcg_ctx, INDEX_op_not_i64, ret, arg1);
    } else {
        TCGv_i64 t0 = tcg_const_i64(tcg_ctx, arg2);
        tcg_gen_xor_i64(tcg_ctx, ret, arg1, t0);
        tcg_temp_free_i64(tcg_ctx, t0);
    }
#endif
}